

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void EthBasePort::PrintIP(ostream *outStr,char *name,uint8_t *addr,bool swap16)

{
  size_t sVar1;
  ostream *poVar2;
  byte *pbVar3;
  long *plVar4;
  undefined7 in_register_00000009;
  long lVar5;
  long lVar6;
  
  if ((int)CONCAT71(in_register_00000009,swap16) == 0) {
    if (name == (char *)0x0) {
      std::ios::clear((int)outStr + (int)*(undefined8 *)(*(long *)outStr + -0x18));
    }
    else {
      sVar1 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(outStr,name,sVar1);
    }
    lVar6 = 2;
    std::__ostream_insert<char,std::char_traits<char>>(outStr,": ",2);
    *(uint *)(outStr + *(long *)(*(long *)outStr + -0x18) + 0x18) =
         *(uint *)(outStr + *(long *)(*(long *)outStr + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)outStr,(uint)*addr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
    pbVar3 = addr + 1;
    lVar5 = 3;
  }
  else {
    if (name == (char *)0x0) {
      std::ios::clear((int)outStr + (int)*(undefined8 *)(*(long *)outStr + -0x18));
    }
    else {
      sVar1 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(outStr,name,sVar1);
    }
    lVar5 = 2;
    std::__ostream_insert<char,std::char_traits<char>>(outStr,": ",2);
    *(uint *)(outStr + *(long *)(*(long *)outStr + -0x18) + 0x18) =
         *(uint *)(outStr + *(long *)(*(long *)outStr + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)outStr,(uint)addr[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
    lVar6 = 3;
    pbVar3 = addr;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)*pbVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)addr[lVar6]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  plVar4 = (long *)std::ostream::operator<<((ostream *)poVar2,(uint)addr[lVar5]);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

void EthBasePort::PrintIP(std::ostream &outStr, const char* name, const uint8_t *addr, bool swap16)
{
    if (swap16) {
        outStr << name << ": " << std::dec
               << (int)addr[1] << "." << (int)addr[0] << "." << (int)addr[3] << "." << (int)addr[2]
               << std::endl;
    }
    else {
        outStr << name << ": " << std::dec
               << (int)addr[0] << "." << (int)addr[1] << "." << (int)addr[2] << "." << (int)addr[3]
               << std::endl;
    }
}